

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_create_prefix(netaddr *prefix,netaddr *host,netaddr *netmask,_Bool truncate)

{
  uint8_t uVar1;
  byte bVar2;
  int local_30;
  int maxlen;
  int len;
  _Bool truncate_local;
  netaddr *netmask_local;
  netaddr *host_local;
  netaddr *prefix_local;
  
  if ((host->_type == netmask->_type) && (host->_type != '\0')) {
    bVar2 = netaddr_get_af_maxprefix((uint)host->_type);
    prefix->_prefix_len = '\0';
    prefix->_type = host->_type;
    if (!truncate) {
      *(undefined8 *)prefix->_addr = *(undefined8 *)host->_addr;
      *(undefined8 *)(prefix->_addr + 8) = *(undefined8 *)(host->_addr + 8);
    }
    for (local_30 = 0; local_30 < (int)(bVar2 / 8); local_30 = local_30 + 2) {
      if (truncate) {
        prefix->_addr[local_30] = host->_addr[local_30] & netmask->_addr[local_30];
      }
      uVar1 = netmask->_addr[local_30];
      if (uVar1 == '\0') {
        return 0;
      }
      if (uVar1 == 0x80) {
        prefix->_prefix_len = prefix->_prefix_len + '\x01';
        return 0;
      }
      if (uVar1 == 0xc0) {
        prefix->_prefix_len = prefix->_prefix_len + '\x02';
        return 0;
      }
      if (uVar1 == 0xe0) {
        prefix->_prefix_len = prefix->_prefix_len + '\x03';
        return 0;
      }
      if (uVar1 == 0xf0) {
        prefix->_prefix_len = prefix->_prefix_len + '\x04';
        return 0;
      }
      if (uVar1 == 0xf8) {
        prefix->_prefix_len = prefix->_prefix_len + '\x05';
        return 0;
      }
      if (uVar1 == 0xfc) {
        prefix->_prefix_len = prefix->_prefix_len + '\x06';
        return 0;
      }
      if (uVar1 == 0xfe) {
        prefix->_prefix_len = prefix->_prefix_len + '\a';
        return 0;
      }
      if (uVar1 != 0xff) {
        return -1;
      }
      prefix->_prefix_len = prefix->_prefix_len + '\b';
    }
    prefix_local._4_4_ = 0;
  }
  else {
    prefix_local._4_4_ = -1;
  }
  return prefix_local._4_4_;
}

Assistant:

int
netaddr_create_prefix(
  struct netaddr *prefix, const struct netaddr *host, const struct netaddr *netmask, bool truncate) {
  int len, maxlen;
  if (host->_type != netmask->_type || host->_type == AF_UNSPEC) {
    return -1;
  }

  /* get address length */
  maxlen = netaddr_get_af_maxprefix(host->_type) / 8;

  /* initialize prefix */
  prefix->_prefix_len = 0;
  prefix->_type = host->_type;

  if (!truncate) {
    memcpy(&prefix->_addr[0], &host->_addr[0], 16);
  }

  for (len = 0; len < maxlen; len++) {
    if (truncate) {
      prefix->_addr[len] = host->_addr[len] & netmask->_addr[len];
    }

    switch (netmask->_addr[len]) {
      case 255:
        len++;
        prefix->_prefix_len += 8;
        break;
      case 254:
        prefix->_prefix_len += 7;
        return 0;
      case 252:
        prefix->_prefix_len += 6;
        return 0;
      case 248:
        prefix->_prefix_len += 5;
        return 0;
      case 240:
        prefix->_prefix_len += 4;
        return 0;
      case 224:
        prefix->_prefix_len += 3;
        return 0;
      case 192:
        prefix->_prefix_len += 2;
        return 0;
      case 128:
        prefix->_prefix_len += 1;
        return 0;
      case 0:
        return 0;
      default:
        return -1;
    }
  }
  return 0;
}